

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

bool __thiscall ctemplate::TemplateCache::Delete(TemplateCache *this,TemplateString *key)

{
  int iVar1;
  Mutex *pMVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  pair<unsigned_long,_int> *ppVar6;
  bool bVar7;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> to_erase;
  pair<unsigned_long,_int> *local_48;
  iterator iStack_40;
  pair<unsigned_long,_int> *local_38;
  
  pMVar2 = this->mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = pMVar2->mutex_ + -1;
  if (iVar1 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  if (this->is_frozen_ == false) {
    local_48 = (pair<unsigned_long,_int> *)0x0;
    iStack_40._M_current = (pair<unsigned_long,_int> *)0x0;
    local_38 = (pair<unsigned_long,_int> *)0x0;
    p_Var5 = (_Hash_node_base *)TemplateString::GetGlobalId(key);
    ppVar6 = local_48;
    for (p_Var3 = (this->parsed_template_cache_->_M_h)._M_before_begin._M_nxt; local_48 = ppVar6,
        p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      if (p_Var3[1]._M_nxt == p_Var5) {
        RefcountedTemplate::DecRefN((RefcountedTemplate *)p_Var3[3]._M_nxt,1);
        if (iStack_40._M_current == local_38) {
          std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
          _M_realloc_insert<std::pair<unsigned_long,int>const&>
                    ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                      *)&local_48,iStack_40,(pair<unsigned_long,_int> *)(p_Var3 + 1));
        }
        else {
          p_Var4 = p_Var3[2]._M_nxt;
          (iStack_40._M_current)->first = ((pair<unsigned_long,_int> *)(p_Var3 + 1))->first;
          *(_Hash_node_base **)&(iStack_40._M_current)->second = p_Var4;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
      }
      ppVar6 = local_48;
    }
    for (; ppVar6 != iStack_40._M_current; ppVar6 = ppVar6 + 1) {
      std::
      _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&this->parsed_template_cache_->_M_h,ppVar6);
    }
    bVar7 = local_48 != iStack_40._M_current;
    if (local_48 != (pair<unsigned_long,_int> *)0x0) {
      operator_delete(local_48);
    }
  }
  else {
    bVar7 = false;
  }
  pMVar2->mutex_ = pMVar2->mutex_ + 1;
  if (pMVar2->mutex_ == 0) {
    return bVar7;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xeb,"void ctemplate::Mutex::Unlock()");
}

Assistant:

bool TemplateCache::Delete(const TemplateString& key) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // Cannot delete from a frozen cache.
    return false;
  }
  vector<TemplateCacheKey> to_erase;
  const TemplateId key_id = key.GetGlobalId();
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();  ++it) {
    if (it->first.first == key_id) {
      // We'll delete the content pointed to by the entry here, since
      // it's handy, but we won't delete the entry itself quite yet.
      it->second.refcounted_tpl->DecRef();
      to_erase.push_back(it->first);
    }
  }
  for (vector<TemplateCacheKey>::iterator it = to_erase.begin();
       it != to_erase.end(); ++it) {
    parsed_template_cache_->erase(*it);
  }
  return !to_erase.empty();
}